

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O3

bool __thiscall
slang::parsing::Preprocessor::expandMacro
          (Preprocessor *this,MacroDef macro,MacroExpansion *expansion,
          MacroActualArgumentListSyntax *actualArgs)

{
  char *pcVar1;
  long lVar2;
  MacroFormalArgumentListSyntax *pMVar3;
  SourceManager *this_00;
  size_t sVar4;
  BumpAllocator *pBVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar6;
  uint uVar7;
  undefined2 uVar8;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined4 uVar13;
  string_view rawText;
  Token token_00;
  size_t *psVar14;
  Preprocessor *pPVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  SourceLocation SVar19;
  Info *pIVar20;
  Info *pIVar21;
  undefined4 extraout_var;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar22;
  uint64_t hash;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  arrays_type *arrays_;
  Token *pTVar23;
  SourceLocation SVar24;
  Token *pTVar25;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar26;
  DefineDirectiveSyntax *pDVar27;
  ulong uVar28;
  arrays_type *paVar29;
  arrays_type *paVar30;
  long lVar31;
  ArgTokens *args_2;
  pointer pTVar32;
  pointer pTVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  string_view sVar52;
  SourceRange SVar53;
  Token TVar54;
  string_view macroName;
  string_view macroName_00;
  Token TVar55;
  string_view rawText_00;
  bool inDefineDirective;
  Token token;
  Token empty;
  SourceRange expansionRange;
  string_view name;
  anon_class_64_8_ed10e8cd handleToken;
  SourceLocation start;
  Token endOfArgs;
  SourceLocation start_1;
  SourceLocation expansionLoc;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
  argumentMap;
  anon_class_32_4_0a8075ed append;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  undefined1 in_stack_fffffffffffffc20;
  undefined7 in_stack_fffffffffffffc21;
  SmallVectorBase<slang::parsing::Token> *in_stack_fffffffffffffc28;
  TriviaKind local_3ca;
  undefined1 local_3c9 [9];
  Info *pIStack_3c0;
  char *local_3b0;
  Preprocessor *local_3a8;
  DefineDirectiveSyntax *local_3a0;
  Token local_398;
  SourceRange local_388;
  SmallVectorBase<slang::parsing::Trivia> local_378;
  anon_class_64_8_ed10e8cd local_340;
  undefined1 *local_300;
  arrays_type *local_2f8;
  arrays_type *local_2f0;
  arrays_type *local_2e8;
  ulong local_2e0;
  uint64_t local_2d8;
  size_t local_2d0;
  SourceLocation local_2c8;
  Token local_2c0;
  undefined8 local_2b0;
  char *pcStack_2a8;
  undefined1 local_2a0 [16];
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> *local_290;
  undefined1 local_288 [128];
  char local_208;
  char cStack_207;
  char cStack_206;
  char cStack_205;
  char cStack_204;
  char cStack_203;
  char cStack_202;
  char cStack_201;
  char cStack_200;
  char cStack_1ff;
  char cStack_1fe;
  char cStack_1fd;
  char cStack_1fc;
  char cStack_1fb;
  char cStack_1fa;
  char cStack_1f9;
  char local_1f8;
  char cStack_1f7;
  char cStack_1f6;
  char cStack_1f5;
  char cStack_1f4;
  char cStack_1f3;
  char cStack_1f2;
  char cStack_1f1;
  char cStack_1f0;
  char cStack_1ef;
  char cStack_1ee;
  char cStack_1ed;
  char cStack_1ec;
  char cStack_1eb;
  char cStack_1ea;
  char cStack_1e9;
  SourceLocation local_1e0;
  undefined1 local_1d8 [328];
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
  *local_90;
  undefined8 local_88;
  arrays_type *local_80;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  anon_class_32_4_0a8075ed local_50;
  undefined6 uVar10;
  undefined5 uVar12;
  
  pDVar27 = macro.syntax;
  if (macro.intrinsic == None) {
    if ((pDVar27->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
        _M_extent_value == 0) {
      return true;
    }
    sVar52 = Token::valueText(&pDVar27->name);
    local_3b0 = sVar52._M_str;
    pMVar3 = pDVar27->formalArguments;
    if (pMVar3 != (MacroFormalArgumentListSyntax *)0x0) {
      if ((pMVar3->args).elements._M_extent._M_extent_value + 1 >> 1 <
          (actualArgs->args).elements._M_extent._M_extent_value + 1 >> 1) {
        local_2d0 = sVar52._M_len;
        local_1d8._0_16_ =
             (undefined1  [16])
             slang::syntax::SyntaxNode::getFirstToken(&actualArgs->super_SyntaxNode);
        SVar19 = Token::location((Token *)local_1d8);
        addDiag(this,(DiagCode)0x160004,SVar19);
        return false;
      }
      local_1d8._320_8_ = local_1d8;
      local_88 = 0x3f;
      local_80 = (arrays_type *)0x1;
      local_70 = 0;
      local_78 = &boost::unordered::detail::foa::
                  dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                  ::storage;
      local_68 = (undefined1  [16])0x0;
      local_3a8 = this;
      local_3a0 = pDVar27;
      local_90 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                  *)local_1d8._320_8_;
      if (1 < (pMVar3->args).elements._M_extent._M_extent_value + 1) {
        uVar34 = 0;
        do {
          local_3b0 = sVar52._M_str;
          local_2d0 = sVar52._M_len;
          ppSVar22 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                               ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *
                                )((pMVar3->args).elements._M_ptr + uVar34 * 2));
          pSVar6 = *ppSVar22;
          if (uVar34 < (actualArgs->args).elements._M_extent._M_extent_value + 1 >> 1) {
            ppSVar22 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)((actualArgs->args).elements._M_ptr + uVar34 * 2));
            pSVar26 = *ppSVar22 + 1;
            if ((*(long *)(*ppSVar22 + 3) == 0) && (pSVar6[1].previewNode != (SyntaxNode *)0x0)) {
              pSVar26 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)
                        &pSVar6[1].previewNode[1].previewNode;
            }
          }
          else {
            if (pSVar6[1].previewNode == (SyntaxNode *)0x0) {
              SVar19 = Token::location(&actualArgs->closeParen);
              addDiag(local_3a8,(DiagCode)0x140004,SVar19);
              goto LAB_002033c9;
            }
            pSVar26 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)
                      &pSVar6[1].previewNode[1].previewNode;
          }
          local_378._0_16_ = Token::valueText((Token *)(pSVar6 + 1));
          if (local_378.data_ != 0) {
            local_340.inDefineDirective = (bool *)pSVar26[1].previewNode;
            local_340.append = *(anon_class_32_4_0a8075ed **)(pSVar26 + 2);
            local_340.argumentMap =
                 (SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                  *)((ulong)local_340.argumentMap & 0xffffffffffffff00);
            hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &local_90,
                              (basic_string_view<char,_std::char_traits<char>_> *)&local_378);
            arrays_ = (arrays_type *)(hash >> ((byte)local_88 & 0x3f));
            lVar31 = (hash & 0xff) * 4;
            cVar36 = (&UNK_0048f58c)[lVar31];
            cVar37 = (&UNK_0048f58d)[lVar31];
            cVar38 = (&UNK_0048f58e)[lVar31];
            cVar39 = (&UNK_0048f58f)[lVar31];
            uVar28 = (ulong)((uint)hash & 7);
            paVar30 = (arrays_type *)0x0;
            paVar29 = arrays_;
            cVar40 = cVar36;
            cVar41 = cVar37;
            cVar42 = cVar38;
            cVar43 = cVar39;
            cVar44 = cVar36;
            cVar45 = cVar37;
            cVar46 = cVar38;
            cVar47 = cVar39;
            cVar48 = cVar36;
            cVar49 = cVar37;
            cVar50 = cVar38;
            cVar51 = cVar39;
            do {
              lVar31 = (long)paVar29 * 0x10;
              pcVar1 = local_78 + lVar31;
              local_1f8 = *pcVar1;
              cStack_1f7 = pcVar1[1];
              cStack_1f6 = pcVar1[2];
              cStack_1f5 = pcVar1[3];
              cStack_1f4 = pcVar1[4];
              cStack_1f3 = pcVar1[5];
              cStack_1f2 = pcVar1[6];
              cStack_1f1 = pcVar1[7];
              cStack_1f0 = pcVar1[8];
              cStack_1ef = pcVar1[9];
              cStack_1ee = pcVar1[10];
              cStack_1ed = pcVar1[0xb];
              cStack_1ec = pcVar1[0xc];
              cStack_1eb = pcVar1[0xd];
              cStack_1ea = pcVar1[0xe];
              cStack_1e9 = pcVar1[0xf];
              auVar35[0] = -(local_1f8 == cVar36);
              auVar35[1] = -(cStack_1f7 == cVar37);
              auVar35[2] = -(cStack_1f6 == cVar38);
              auVar35[3] = -(cStack_1f5 == cVar39);
              auVar35[4] = -(cStack_1f4 == cVar40);
              auVar35[5] = -(cStack_1f3 == cVar41);
              auVar35[6] = -(cStack_1f2 == cVar42);
              auVar35[7] = -(cStack_1f1 == cVar43);
              auVar35[8] = -(cStack_1f0 == cVar44);
              auVar35[9] = -(cStack_1ef == cVar45);
              auVar35[10] = -(cStack_1ee == cVar46);
              auVar35[0xb] = -(cStack_1ed == cVar47);
              auVar35[0xc] = -(cStack_1ec == cVar48);
              auVar35[0xd] = -(cStack_1eb == cVar49);
              auVar35[0xe] = -(cStack_1ea == cVar50);
              auVar35[0xf] = -(cStack_1e9 == cVar51);
              uVar18 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe);
              if (uVar18 == 0) {
                args_2 = (ArgTokens *)CONCAT71((int7)((ulong)lVar31 >> 8),cStack_1e9);
              }
              else {
                local_300 = local_78 + lVar31;
                lVar2 = local_70 + (long)paVar29 * 600;
                local_2f8 = arrays_;
                local_2f0 = paVar30;
                local_2e8 = paVar29;
                local_2e0 = uVar28;
                local_2d8 = hash;
                local_208 = cVar36;
                cStack_207 = cVar37;
                cStack_206 = cVar38;
                cStack_205 = cVar39;
                cStack_204 = cVar40;
                cStack_203 = cVar41;
                cStack_202 = cVar42;
                cStack_201 = cVar43;
                cStack_200 = cVar44;
                cStack_1ff = cVar45;
                cStack_1fe = cVar46;
                cStack_1fd = cVar47;
                cStack_1fc = cVar48;
                cStack_1fb = cVar49;
                cStack_1fa = cVar50;
                cStack_1f9 = cVar51;
                do {
                  uVar7 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                    }
                  }
                  bVar16 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                           operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                       *)&local_90,
                                      (basic_string_view<char,_std::char_traits<char>_> *)&local_378
                                      ,(basic_string_view<char,_std::char_traits<char>_> *)
                                       ((ulong)uVar7 * 0x28 + lVar2));
                  if (bVar16) goto LAB_0020319b;
                  uVar18 = uVar18 - 1 & uVar18;
                } while (uVar18 != 0);
                args_2 = (ArgTokens *)CONCAT71((int7)((ulong)lVar31 >> 8),local_300[0xf]);
                hash = local_2d8;
                arrays_ = local_2f8;
                uVar28 = local_2e0;
                paVar29 = local_2e8;
                paVar30 = local_2f0;
                cVar36 = local_208;
                cVar37 = cStack_207;
                cVar38 = cStack_206;
                cVar39 = cStack_205;
                cVar40 = cStack_204;
                cVar41 = cStack_203;
                cVar42 = cStack_202;
                cVar43 = cStack_201;
                cVar44 = cStack_200;
                cVar45 = cStack_1ff;
                cVar46 = cStack_1fe;
                cVar47 = cStack_1fd;
                cVar48 = cStack_1fc;
                cVar49 = cStack_1fb;
                cVar50 = cStack_1fa;
                cVar51 = cStack_1f9;
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[uVar28] & (byte)args_2) == 0) break;
              psVar14 = &paVar30->groups_size_index;
              paVar30 = (arrays_type *)((long)&paVar30->groups_size_index + 1);
              paVar29 = (arrays_type *)
                        ((ulong)((long)psVar14 + (long)((long)&paVar29->groups_size_index + 1)) &
                        (ulong)local_80);
            } while (paVar30 <= local_80);
            if ((ulong)local_68._8_8_ < (ulong)local_68._0_8_) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
              ::
              nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                        ((locator *)local_2a0,&local_88,arrays_,hash,(size_t)&local_378,
                         (try_emplace_args_t *)&local_340,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                         (ArgTokens *)CONCAT71(in_stack_fffffffffffffc21,in_stack_fffffffffffffc20))
              ;
              local_68._8_8_ = local_68._8_8_ + 1;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                        ((locator *)local_2a0,&local_90,hash,(try_emplace_args_t *)&local_378,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_340,args_2);
            }
          }
LAB_0020319b:
          sVar52._M_str = local_3b0;
          sVar52._M_len = local_2d0;
          uVar34 = uVar34 + 1;
        } while (uVar34 < (pMVar3->args).elements._M_extent._M_extent_value + 1 >> 1);
      }
      local_3b0 = sVar52._M_str;
      local_2d0 = sVar52._M_len;
      local_2c0 = slang::syntax::SyntaxNode::getLastToken(&actualArgs->super_SyntaxNode);
      SVar53 = MacroExpansion::getRange(expansion);
      sVar4 = local_2d0;
      pPVar15 = local_3a8;
      SVar19 = Token::location(&local_2c0);
      sVar52 = Token::rawText(&local_2c0);
      local_388.endLoc = (SourceLocation)(sVar52._M_len * 0x10000000 + (long)SVar19);
      local_388.startLoc = SVar53.startLoc;
      local_2c8 = Token::location((local_3a0->body).
                                  super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr);
      SVar53.endLoc = local_388.endLoc;
      SVar53.startLoc = local_388.startLoc;
      macroName_00._M_str = local_3b0;
      macroName_00._M_len = sVar4;
      local_1e0 = SourceManager::createExpansionLoc
                            (pPVar15->sourceManager,local_2c8,SVar53,macroName_00);
      local_340.expansionLoc = &local_1e0;
      local_340.append = &local_50;
      local_340.start = &local_2c8;
      local_340.expansionRange = &local_388;
      local_340.inDefineDirective = (bool *)local_3c9;
      local_3c9[0] = Unknown;
      local_340.argumentMap =
           (SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
            *)local_1d8;
      local_340.this = pPVar15;
      sVar4 = (local_3a0->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
              _M_extent_value;
      bVar16 = true;
      local_340.expansion = expansion;
      local_50.expansion = expansion;
      local_50.expansionLoc = local_340.expansionLoc;
      local_50.start = local_340.start;
      local_50.expansionRange = local_340.expansionRange;
      if (sVar4 != 0) {
        pTVar32 = (local_3a0->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr
        ;
        pTVar33 = pTVar32 + sVar4;
        do {
          uVar8 = pTVar32->kind;
          uVar9 = pTVar32->field_0x2;
          uVar11 = pTVar32->numFlags;
          uVar13 = pTVar32->rawLen;
          uVar12 = CONCAT41(uVar13,uVar11);
          uVar10 = CONCAT51(uVar12,uVar9);
          pIStack_3c0 = pTVar32->info;
          pTVar23 = (Token *)(local_3c9 + 1);
          local_3c9._1_2_ = uVar8;
          local_3c9._3_6_ = uVar10;
          if (((uVar8 == UserDefinedNetDeclaration >> 8) &&
              (sVar52 = Token::rawText(pTVar23), sVar52._M_len != 0)) &&
             (sVar52 = Token::rawText(pTVar23), *sVar52._M_str == '\\')) {
            local_2a0 = (undefined1  [16])Token::rawText(pTVar23);
            pIVar20 = (Info *)std::basic_string_view<char,_std::char_traits<char>_>::find
                                        ((basic_string_view<char,_std::char_traits<char>_> *)
                                         local_2a0,"``",0,2);
            if (pIVar20 == (Info *)0xffffffffffffffff) goto LAB_002030bc;
            pBVar5 = pPVar15->alloc;
            sVar52 = Token::rawText(pTVar23);
            pIVar21 = (Info *)sVar52._M_len;
            if (pIVar20 <= (Info *)sVar52._M_len) {
              pIVar21 = pIVar20;
            }
            rawText_00._M_str = sVar52._M_str;
            rawText_00._M_len = (size_t)pIVar21;
            TVar54 = Token::withRawText(pTVar23,pBVar5,rawText_00);
            bVar16 = expandMacro::anon_class_64_8_ed10e8cd::operator()(&local_340,TVar54);
            if (!bVar16) goto LAB_002033c9;
            local_2a0._8_8_ = 0;
            local_2a0._0_8_ = local_288;
            local_290 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>
                         *)0x8;
            TVar55.info = pIVar20;
            TVar55._0_8_ = pIStack_3c0;
            Lexer::splitTokens((Lexer *)pPVar15->alloc,(BumpAllocator *)pPVar15->diagnostics,
                               (Diagnostics *)pPVar15->sourceManager,
                               (SourceManager *)CONCAT62(local_3c9._3_6_,local_3c9._1_2_),TVar55,
                               CONCAT44(in_stack_fffffffffffffc1c,
                                        (uint)(pPVar15->keywordVersionStack).
                                              super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
                                              ._M_impl.super__Vector_impl_data._M_finish[-1]),
                               (KeywordVersion)local_2a0,in_stack_fffffffffffffc28);
            if ((char *)local_2a0._8_8_ == (char *)0x0) {
LAB_002030b8:
              bVar16 = true;
            }
            else {
              SVar24 = (SourceLocation)(local_2a0._8_8_ * 0x10 + local_2a0._0_8_);
              SVar19 = (SourceLocation)local_2a0._0_8_;
              do {
                bVar16 = expandMacro::anon_class_64_8_ed10e8cd::operator()
                                   (&local_340,*(Token *)SVar19);
                if (!bVar16) goto LAB_002030ed;
                SVar19 = (SourceLocation)((long)SVar19 + 0x10);
              } while (SVar19 != SVar24);
              if ((char *)local_2a0._8_8_ == (char *)0x0) goto LAB_002030b8;
              local_378.len = 0;
              local_378.data_ = (pointer)local_378.firstElement;
              local_378.cap = 2;
              local_3ca = Whitespace;
              local_398.kind = EndOfFile;
              local_398._2_1_ = 0;
              local_398.numFlags.raw = '\0';
              local_398.rawLen = 0;
              local_398.info = (Info *)0x4c1e36;
              SmallVectorBase<slang::parsing::Trivia>::
              emplace_back<slang::parsing::TriviaKind,std::basic_string_view<char,std::char_traits<char>>>
                        (&local_378,&local_3ca,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_398);
              SVar19 = Token::location((Token *)(local_2a0._0_8_ + local_2a0._8_8_ * 0x10 + -0x10));
              sVar52 = Token::rawText((Token *)(local_2a0._0_8_ + local_2a0._8_8_ * 0x10 + -0x10));
              pBVar5 = pPVar15->alloc;
              iVar17 = SmallVectorBase<slang::parsing::Trivia>::copy
                                 (&local_378,(EVP_PKEY_CTX *)pBVar5,(EVP_PKEY_CTX *)sVar52._M_str);
              trivia._M_ptr._4_4_ = extraout_var;
              trivia._M_ptr._0_4_ = iVar17;
              local_2b0 = 0;
              pcStack_2a8 = "";
              in_stack_fffffffffffffc1c = 0;
              rawText._M_str._1_7_ = 0x47e5;
              rawText._0_9_ = (unkuint9)0xa6 << 0x40;
              trivia._M_extent._M_extent_value = extraout_RDX._M_extent_value;
              Token::Token(&local_398,pBVar5,EmptyMacroArgument,trivia,rawText,
                           (SourceLocation)(sVar52._M_len * 0x10000000 + (long)SVar19));
              token_00.info = local_398.info;
              token_00.kind = local_398.kind;
              token_00._2_1_ = local_398._2_1_;
              token_00.numFlags.raw = local_398.numFlags.raw;
              token_00.rawLen = local_398.rawLen;
              bVar16 = expandMacro::anon_class_64_8_ed10e8cd::operator()(&local_340,token_00);
              if (local_378.data_ != (pointer)local_378.firstElement) {
                operator_delete(local_378.data_);
              }
              if (bVar16) goto LAB_002030b8;
LAB_002030ed:
              bVar16 = false;
            }
            if ((undefined1 *)local_2a0._0_8_ != local_288) {
              operator_delete((void *)local_2a0._0_8_);
            }
          }
          else {
LAB_002030bc:
            TVar54._2_6_ = local_3c9._3_6_;
            TVar54.kind = local_3c9._1_2_;
            TVar54.info = pIStack_3c0;
            bVar16 = expandMacro::anon_class_64_8_ed10e8cd::operator()(&local_340,TVar54);
          }
          if (!bVar16) goto LAB_002033c9;
          pTVar32 = pTVar32 + 1;
        } while (pTVar32 != pTVar33);
        bVar16 = true;
      }
      goto LAB_002033cb;
    }
    SVar19 = Token::location((pDVar27->body).
                             super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr);
    local_2a0._0_8_ = SVar19;
    this_00 = this->sourceManager;
    SVar53 = MacroExpansion::getRange(expansion);
    macroName._M_str = local_3b0;
    macroName._M_len = sVar52._M_len;
    local_340.inDefineDirective =
         (bool *)SourceManager::createExpansionLoc(this_00,SVar19,SVar53,macroName);
    sVar4 = (pDVar27->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
            _M_extent_value;
    if (sVar4 != 0) {
      pTVar23 = (pDVar27->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
      pTVar25 = pTVar23 + sVar4;
      do {
        TVar55 = *pTVar23;
        TVar54 = *pTVar23;
        local_1d8._0_16_ = (undefined1  [16])MacroExpansion::getRange(expansion);
        SVar19 = MacroExpansion::adjustLoc
                           (expansion,TVar54,(SourceLocation *)&local_340,
                            (SourceLocation *)local_2a0,(SourceRange)local_1d8._0_16_);
        MacroExpansion::append(expansion,TVar55,SVar19,false);
        pTVar23 = pTVar23 + 1;
      } while (pTVar23 != pTVar25);
    }
  }
  else {
    expandIntrinsic(this,macro.intrinsic,expansion);
  }
  return true;
LAB_002033c9:
  bVar16 = false;
LAB_002033cb:
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
  ::delete_arrays(local_90,local_80);
  return bVar16;
}

Assistant:

bool Preprocessor::expandMacro(MacroDef macro, MacroExpansion& expansion,
                               MacroActualArgumentListSyntax* actualArgs) {
    if (macro.isIntrinsic()) {
        // for now, no intrisics can have arguments
        SLANG_ASSERT(!actualArgs);
        return expandIntrinsic(macro.intrinsic, expansion);
    }

    const DefineDirectiveSyntax* directive = macro.syntax;
    SLANG_ASSERT(directive);

    // ignore empty macro
    const auto& body = directive->body;
    if (body.empty())
        return true;

    std::string_view macroName = directive->name.valueText();

    if (!directive->formalArguments) {
        // each macro expansion gets its own location entry
        SourceLocation start = body[0].location();
        SourceLocation expansionLoc = sourceManager.createExpansionLoc(start, expansion.getRange(),
                                                                       macroName);

        // simple macro; just take body tokens
        for (auto token : body)
            expansion.append(token, expansionLoc, start, expansion.getRange());

        return true;
    }

    // match up actual arguments with formal parameters
    SLANG_ASSERT(actualArgs);
    auto& formalList = directive->formalArguments->args;
    auto& actualList = actualArgs->args;
    if (actualList.size() > formalList.size()) {
        addDiag(diag::TooManyActualMacroArgs, actualArgs->getFirstToken().location());
        return false;
    }

    struct ArgTokens : public std::span<const Token> {
        using std::span<const Token>::span;
        using std::span<const Token>::operator=;
        bool isExpanded = false;
    };
    SmallMap<std::string_view, ArgTokens, 8> argumentMap;

    for (size_t i = 0; i < formalList.size(); i++) {
        auto formal = formalList[i];
        const TokenList* tokenList = nullptr;
        if (actualList.size() > i) {
            // if our actual argument is empty and we have a default, take that
            tokenList = &actualList[i]->tokens;
            if (tokenList->empty() && formal->defaultValue)
                tokenList = &formal->defaultValue->tokens;
        }
        else {
            // if we've run out of actual args make sure we have a default for this one
            if (formal->defaultValue)
                tokenList = &formal->defaultValue->tokens;
            else {
                addDiag(diag::NotEnoughMacroArgs, actualArgs->closeParen.location());
                return false;
            }
        }

        auto name = formal->name.valueText();
        if (!name.empty())
            argumentMap.emplace(name, ArgTokens(*tokenList));
    }

    Token endOfArgs = actualArgs->getLastToken();
    SourceRange expansionRange(expansion.getRange().start(),
                               endOfArgs.location() + endOfArgs.rawText().length());

    SourceLocation start = body[0].location();
    SourceLocation expansionLoc = sourceManager.createExpansionLoc(start, expansionRange,
                                                                   macroName);

    auto append = [&](Token token) {
        expansion.append(token, expansionLoc, start, expansionRange);
        return true;
    };

    bool inDefineDirective = false;

    auto handleToken = [&](Token token) {
        if (inDefineDirective && !token.isOnSameLine())
            inDefineDirective = false;

        if (token.kind != TokenKind::Identifier && !LF::isKeyword(token.kind) &&
            token.kind != TokenKind::Directive) {
            // Non-identifier, can't be argument substituted.
            return append(token);
        }

        std::string_view text = token.valueText();
        if (token.kind == TokenKind::Directive && !text.empty()) {
            if (token.directiveKind() != SyntaxKind::MacroUsage) {
                // If this is the start of a `define directive, note that fact because
                // during argument expansion we will insert line continuations.
                if (token.directiveKind() == SyntaxKind::DefineDirective)
                    inDefineDirective = true;
                return append(token);
            }

            // Other tools allow arguments to replace matching directive names, e.g.:
            // `define FOO(bar) `bar
            // `define ONE 1
            // `FOO(ONE)   // expands to 1
            text = text.substr(1);
        }

        // check for formal param
        auto it = argumentMap.find(text);
        if (it == argumentMap.end())
            return append(token);

        // Fully expand out arguments before substitution to make sure we can detect whether
        // a usage of a macro in a replacement list is valid or an illegal recursion.
        if (!it->second.isExpanded) {
            std::span<const Token> argTokens = it->second;
            SmallSet<const DefineDirectiveSyntax*, 8> alreadyExpanded;
            if (!expandReplacementList(argTokens, alreadyExpanded))
                return false;

            it->second = argTokens;
            it->second.isExpanded = true;
        }

        auto begin = it->second.begin();
        auto end = it->second.end();
        if (begin == end) {
            // The macro argument contained no tokens. We still need to supply an empty token
            // here to ensure that the trivia of the formal parameter is passed on.
            Token empty(alloc, TokenKind::EmptyMacroArgument, token.trivia(), ""sv,
                        token.location());
            return append(empty);
        }

        // We need to ensure that we get correct spacing for the leading token here;
        // it needs to come from the *formal* parameter used in the macro body, not
        // from the argument itself.
        Token first = begin->withTrivia(alloc, token.trivia());
        SourceLocation firstLoc = first.location();

        // Arguments need their own expansion location created; the original
        // location comes from the source file itself, and the expansion location
        // points into the macro body where the formal argument was used.
        SourceLocation tokenLoc = expansion.adjustLoc(token, expansionLoc, start, expansionRange);
        SourceRange argRange(tokenLoc, tokenLoc + token.rawText().length());
        SourceLocation argLoc = sourceManager.createExpansionLoc(firstLoc, argRange, true);

        // See note above about weird macro usage being argument replaced.
        // In that case we want to fabricate the correct directive token here.
        if (token.kind == TokenKind::Directive) {
            Token grave(alloc, TokenKind::Unknown, first.trivia(), "`"sv, firstLoc);
            Token combined = Lexer::concatenateTokens(alloc, sourceManager, grave, first);
            if (combined) {
                first = combined;
            }
            else {
                // Failed to combine, so ignore the grave and issue an error.
                addDiag(diag::MisplacedDirectiveChar, firstLoc);
            }
        }

        if (inDefineDirective) {
            // Inside a define directive we need to insert line continuations
            // any time an expanded token will end up on a new line.
            auto appendBody = [&](Token token) {
                if (!token.isOnSameLine()) {
                    Token lc(alloc, TokenKind::LineContinuation, token.trivia(), "\\"sv,
                             token.location());
                    expansion.append(lc, argLoc, firstLoc, argRange,
                                     /* allowLineContinuation */ true);

                    token = token.withTrivia(alloc, {});
                }
                expansion.append(token, argLoc, firstLoc, argRange);
            };

            appendBody(first);
            for (++begin; begin != end; begin++)
                appendBody(*begin);
        }
        else {
            expansion.append(first, argLoc, firstLoc, argRange);
            for (++begin; begin != end; begin++)
                expansion.append(*begin, argLoc, firstLoc, argRange);
        }

        return true;
    };

    // Now add each body token, substituting arguments as necessary.
    for (auto token : body) {
        if (token.kind == TokenKind::Identifier && !token.rawText().empty() &&
            token.rawText()[0] == '\\') {
            // Escaped identifier, might need to break apart and substitute
            // individual pieces of it.
            size_t index = token.rawText().find("``");
            if (index != std::string_view::npos) {
                Token first = token.withRawText(alloc, token.rawText().substr(0, index));
                if (!handleToken(first))
                    return false;

                SmallVector<Token, 8> splits;
                splitTokens(token, index, splits);
                for (auto t : splits) {
                    if (!handleToken(t))
                        return false;
                }

                // Add an empty argument in here so we can make sure a space ends
                // the escaped identifier once it gets concatenated again.
                if (!splits.empty()) {
                    SmallVector<Trivia> triviaBuf;
                    triviaBuf.emplace_back(TriviaKind::Whitespace, " "sv);

                    auto loc = splits.back().location() + splits.back().rawText().length();
                    Token empty(alloc, TokenKind::EmptyMacroArgument, triviaBuf.copy(alloc), ""sv,
                                loc);

                    if (!handleToken(empty))
                        return false;
                }

                continue;
            }
        }

        if (!handleToken(token))
            return false;
    }

    return true;
}